

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

StringLiteral * __thiscall
slang::BumpAllocator::
emplace<slang::ast::StringLiteral,slang::ast::Type_const&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>,slang::ConstantValue&,slang::SourceRange>
          (BumpAllocator *this,Type *args,basic_string_view<char,_std::char_traits<char>_> *args_1,
          basic_string_view<char,_std::char_traits<char>_> *args_2,ConstantValue *args_3,
          SourceRange *args_4)

{
  string_view rawValue;
  string_view value;
  SourceRange sourceRange;
  StringLiteral *pSVar1;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  SourceLocation in_R9;
  size_t in_stack_ffffffffffffff88;
  StringLiteral *in_stack_ffffffffffffff90;
  BumpAllocator *in_stack_ffffffffffffff98;
  
  pSVar1 = (StringLiteral *)
           allocate(in_stack_ffffffffffffff98,(size_t)in_stack_ffffffffffffff90,
                    in_stack_ffffffffffffff88);
  value._M_str = (char *)*in_RCX;
  value._M_len = (size_t)*(Type **)((long)in_R9 + 8);
  rawValue._M_str = *(char **)in_R9;
  rawValue._M_len = (size_t)pSVar1;
  sourceRange.endLoc = in_R9;
  sourceRange.startLoc = *(SourceLocation *)(in_RDX + 1);
  ast::StringLiteral::StringLiteral
            (in_stack_ffffffffffffff90,*(Type **)((long)in_R9 + 8),value,rawValue,
             (ConstantValue *)*in_RDX,sourceRange);
  return pSVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }